

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tadsrsc.c
# Opt level: O0

opdef * addop(opdef *cur,char *nam,opctxdef *opctx)

{
  int iVar1;
  ushort **ppuVar2;
  size_t sVar3;
  long lVar4;
  int *in_RDX;
  byte *in_RSI;
  opdef *in_RDI;
  bool bVar5;
  unsigned_long fattr;
  unsigned_long fmode;
  char resname [4096];
  opdef *newop;
  char *p;
  opctxdef *in_stack_00002fd0;
  char *in_stack_00002fd8;
  opdef *in_stack_00002fe0;
  char *in_stack_ffffffffffffef98;
  char *in_stack_ffffffffffffefa0;
  char *in_stack_ffffffffffffefa8;
  char *pcVar6;
  int in_stack_ffffffffffffefb0;
  undefined2 in_stack_ffffffffffffefb4;
  undefined1 in_stack_ffffffffffffefb6;
  size_t in_stack_ffffffffffffefb8;
  char *in_stack_ffffffffffffefc0;
  unsigned_long *in_stack_ffffffffffffefc8;
  unsigned_long *in_stack_ffffffffffffefd0;
  int in_stack_ffffffffffffefdc;
  char *in_stack_ffffffffffffefe0;
  byte *local_28;
  opdef *local_8;
  
  local_8 = in_RDI;
  if (in_RDX[2] == 0) {
    local_28 = in_RSI;
    if (*in_RSI == 0x2d) {
      iVar1 = stricmp(in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98);
      if (iVar1 == 0) {
        in_RDX[2] = 1;
      }
      else {
        iVar1 = stricmp(in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98);
        if (iVar1 == 0) {
          in_RDX[1] = 3;
        }
        else {
          iVar1 = stricmp(in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98);
          if (iVar1 == 0) {
            in_RDX[1] = 2;
          }
          else {
            iVar1 = stricmp(in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98);
            if (iVar1 == 0) {
              in_RDX[1] = 1;
            }
            else {
              printf("invalid option: %s",in_RSI);
              errexit(in_stack_ffffffffffffefa0,(long)in_stack_ffffffffffffef98);
            }
          }
        }
      }
    }
    else {
      while( true ) {
        bVar5 = false;
        if (*local_28 != 0) {
          bVar5 = *local_28 != 0x3d;
        }
        if (!bVar5) break;
        local_28 = local_28 + 1;
      }
      if (*local_28 == 0x3d) {
        *local_28 = 0;
        do {
          local_28 = local_28 + 1;
          bVar5 = false;
          if (*local_28 < 0x80) {
            ppuVar2 = __ctype_b_loc();
            bVar5 = ((*ppuVar2)[(int)(uint)*local_28] & 0x2000) != 0;
          }
        } while (bVar5);
      }
      else {
        os_cvt_dir_url(in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8,
                       (char *)(ulong)CONCAT16(in_stack_ffffffffffffefb6,
                                               CONCAT24(in_stack_ffffffffffffefb4,
                                                        in_stack_ffffffffffffefb0)));
        local_28 = &stack0xffffffffffffefc8;
      }
      iVar1 = osfmode(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd0,
                      in_stack_ffffffffffffefc8);
      if ((iVar1 == 0) || (((ulong)in_stack_ffffffffffffefc0 & 0x4000) == 0)) {
        sVar3 = strlen((char *)local_28);
        lVar4 = sVar3 + 0x20;
        sVar3 = strlen((char *)in_RSI);
        local_8 = (opdef *)malloc(lVar4 + sVar3 + 2);
        local_8->opnxt = in_RDI;
        local_8->opflag = in_RDX[1];
        local_8->opres = (char *)(local_8 + 1);
        iVar1 = get_file_restype(in_stack_ffffffffffffefb0,in_stack_ffffffffffffefa8);
        local_8->oprestype = iVar1;
        strcpy(local_8->opres,(char *)local_28);
        pcVar6 = local_8->opres;
        sVar3 = strlen(local_8->opres);
        local_8->opfile = pcVar6 + sVar3 + 1;
        strcpy(local_8->opfile,(char *)in_RSI);
      }
      else {
        local_8 = addopdir(in_stack_00002fe0,in_stack_00002fd8,in_stack_00002fd0);
      }
    }
  }
  else {
    iVar1 = parse_res_type(in_stack_ffffffffffffef98);
    *in_RDX = iVar1;
    in_RDX[2] = 0;
  }
  return local_8;
}

Assistant:

static opdef *addop(opdef *cur, char *nam, opctxdef *opctx)
{
    char  *p;
    opdef *newop;
    char   resname[OSFNMAX];
    unsigned long fmode;
    unsigned long fattr;

    /* see if we're parsing a -type argument */
    if (opctx->doing_type)
    {
        /* 
         *   parse the type name, and store it as the type for following
         *   resources
         */
        opctx->restype = parse_res_type(nam);
        
        /* we're done parsing the -type argument */
        opctx->doing_type = FALSE;

        /* 
         *   we're done parsing this argument - we haven't added any
         *   operations, so return old list head 
         */
        return cur;
    }

    /* see if we have an option */
    if (*nam == '-')
    {
        /* see what we have */
        if (!stricmp(nam, "-type"))
        {
            /* 
             *   note that we're doing a type, so we parse it on the next
             *   argument 
             */
            opctx->doing_type = TRUE;
        }
        else if (!stricmp(nam, "-replace"))
        {
            /* set current flags to replace */
            opctx->flag = OPFADD | OPFDEL;
        }
        else if (!stricmp(nam, "-delete"))
        {
            /* set current flags to delete */
            opctx->flag = OPFDEL;
        }
        else if (!stricmp(nam, "-add"))
        {
            /* set current flags to add */
            opctx->flag = OPFADD;
        }
        else
        {
            /* invalid argument */
            rscptf("invalid option: %s", nam);
            errexit("", 1);
        }

        /* 
         *   done parsing this option - we didn't add a new operation, so
         *   return the current list head 
         */
        return cur;
    }

    /* look for '=' */
    for (p = nam ; *p && *p != '=' ; ++p);
    if (*p == '=')
    {
        /* 
         *   We found an '=', so an explicit resource name follows - use
         *   the given string as the resource name rather than basing the
         *   resource name on the filename.  First, overwrite the '=' with
         *   a null byte so that the filename string is terminated.  
         */
        *p = '\0';

        /* skip the '=' (now the null byte, of course) */
        ++p;

        /* 
         *   skip any spaces after the '='; leave p pointing to the start
         *   of the resource name 
         */
        while (t_isspace(*p))
            ++p;
    }
    else
    {
        /* 
         *   A resource name wasn't specified - synthesize a resource name
         *   based on the filename by converting from the local file system
         *   name to a relative URL 
         */
        os_cvt_dir_url(resname, sizeof(resname), nam);

        /* point p to the synthesized resource name */
        p = resname;
    }
    
    /*
     *   If we're adding a directory, rather than returning a single op
     *   for the directory, expand the directory into ops for for all of
     *   the files in the directory. 
     */
    if (osfmode(nam, TRUE, &fmode, &fattr)
        && (fmode & OSFMODE_DIR) != 0)
        return addopdir(cur, nam, opctx);
    
    /* allocate space and set up new op */
    newop = (opdef *)malloc(sizeof(opdef) + strlen(p) + strlen(nam) + 2);

    newop->opnxt  = cur;
    newop->opflag = opctx->flag;
    newop->opres  = (char *)(newop + 1);
    newop->oprestype = get_file_restype(opctx->restype, nam);
    strcpy(newop->opres, p);
    newop->opfile = newop->opres + strlen(newop->opres) + 1;
    strcpy(newop->opfile, nam);

    return(newop);
}